

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O0

string * __thiscall
google::protobuf::MessageLite::SerializePartialAsString_abi_cxx11_
          (string *__return_storage_ptr__,MessageLite *this)

{
  bool bVar1;
  MessageLite *this_local;
  string *output;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  bVar1 = AppendPartialToString(this,__return_storage_ptr__);
  if (!bVar1) {
    std::__cxx11::string::clear();
  }
  return __return_storage_ptr__;
}

Assistant:

std::string MessageLite::SerializePartialAsString() const {
  std::string output;
  if (!AppendPartialToString(&output)) output.clear();
  return output;
}